

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void testing::Mock::UnregisterLocked(UntypedFunctionMockerBase *mocker)

{
  bool bVar1;
  StateMap *pSVar2;
  pointer ppVar3;
  FunctionMockers *this;
  size_type sVar4;
  map<void_const*,testing::(anonymous_namespace)::MockObjectState,std::less<void_const*>,std::allocator<std::pair<void_const*const,testing::(anonymous_namespace)::MockObjectState>>>
  *this_00;
  FunctionMockers *mockers;
  _Self local_18;
  iterator it;
  UntypedFunctionMockerBase *mocker_local;
  
  it._M_node = (_Base_ptr)mocker;
  internal::Mutex::AssertHeld((Mutex *)&internal::g_gmock_mutex);
  pSVar2 = anon_unknown_6::MockObjectRegistry::states
                     ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
       ::begin(pSVar2);
  while( true ) {
    pSVar2 = anon_unknown_6::MockObjectRegistry::states
                       ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
    mockers = (FunctionMockers *)
              std::
              map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
              ::end(pSVar2);
    bVar1 = std::operator!=(&local_18,(_Self *)&mockers);
    if (!bVar1) {
      return;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
             ::operator->(&local_18);
    this = &(ppVar3->second).function_mockers;
    sVar4 = std::
            set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
            ::erase(this,(key_type *)&it);
    if (sVar4 != 0) break;
    std::
    _Rb_tree_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
    ::operator++(&local_18);
  }
  bVar1 = std::
          set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
          ::empty(this);
  if (!bVar1) {
    return;
  }
  this_00 = (map<void_const*,testing::(anonymous_namespace)::MockObjectState,std::less<void_const*>,std::allocator<std::pair<void_const*const,testing::(anonymous_namespace)::MockObjectState>>>
             *)anon_unknown_6::MockObjectRegistry::states
                         ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  std::
  map<void_const*,testing::(anonymous_namespace)::MockObjectState,std::less<void_const*>,std::allocator<std::pair<void_const*const,testing::(anonymous_namespace)::MockObjectState>>>
  ::erase_abi_cxx11_(this_00,(iterator)local_18._M_node);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(internal::g_gmock_mutex) {
  internal::g_gmock_mutex.AssertHeld();
  for (MockObjectRegistry::StateMap::iterator it =
           g_mock_object_registry.states().begin();
       it != g_mock_object_registry.states().end(); ++it) {
    FunctionMockers& mockers = it->second.function_mockers;
    if (mockers.erase(mocker) > 0) {
      // mocker was in mockers and has been just removed.
      if (mockers.empty()) {
        g_mock_object_registry.states().erase(it);
      }
      return;
    }
  }
}